

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov4.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__haystack;
  double dVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  pointer pOVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  Size local_348;
  undefined8 uStack_340;
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  int local_2e4;
  Size label_size;
  float mean_vals [3];
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  Mat out;
  Extractor ex;
  VideoCapture cap;
  Mat frame;
  int local_1e0;
  int local_1dc;
  uchar *local_1d8;
  Mat in;
  Net yolov4;
  
  cv::Mat::Mat(&frame);
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cv::VideoCapture::VideoCapture(&cap);
  ncnn::Net::Net(&yolov4);
  if (argc < 2) {
    main_cold_2();
  }
  else {
    __haystack = argv[1];
    dVar1 = ncnn::get_current_time();
    yolov4.opt.num_threads = 4;
    yolov4.opt.use_vulkan_compute = true;
    yolov4.opt.use_winograd_convolution = true;
    yolov4.opt.use_sgemm_convolution = true;
    yolov4.opt.use_fp16_packed = true;
    yolov4.opt.use_fp16_storage = true;
    yolov4.opt.use_fp16_arithmetic = true;
    yolov4.opt.use_packing_layout = true;
    yolov4.opt.use_shader_pack8 = false;
    yolov4.opt.use_image_storage = false;
    uVar7 = ncnn::Net::load_param(&yolov4,"yolov4-tiny-opt.param");
    if (uVar7 == 0) {
      uVar7 = ncnn::Net::load_model(&yolov4,"yolov4-tiny-opt.bin");
    }
    if (uVar7 == 0) {
      dVar2 = ncnn::get_current_time();
      fprintf(_stdout,"NCNN Init time %.02lfms\n",SUB84(dVar2 - dVar1,0));
      pcVar9 = strstr(__haystack,"/dev/video");
      if (pcVar9 == (char *)0x0) {
        std::__cxx11::string::string((string *)&out,argv[1],(allocator *)local_358);
        cv::imread((string *)&in,(int)&out);
        cv::Mat::operator=(&frame,(Mat *)&in);
        cv::Mat::~Mat((Mat *)&in);
        if ((size_t *)out.data != &out.elemsize) {
          operator_delete(out.data);
        }
        cVar6 = cv::Mat::empty();
        if (cVar6 == '\0') {
LAB_0013c188:
          do {
            if (pcVar9 != (char *)0x0) {
              dVar1 = ncnn::get_current_time();
              cv::VideoCapture::operator>>(&cap,&frame);
              dVar2 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN OpenCV capture time %.02lfms\n",SUB84(dVar2 - dVar1,0));
              cVar6 = cv::Mat::empty();
              if (cVar6 != '\0') {
                fprintf(_stderr,"OpenCV Failed to Capture from device %s\n",__haystack);
                local_2e4 = -1;
                break;
              }
            }
            dVar1 = ncnn::get_current_time();
            ncnn::Mat::from_pixels_resize
                      (&in,local_1d8,0x10002,local_1dc,local_1e0,0x1a0,0x1a0,(Allocator *)0x0);
            stack0xfffffffffffffd30 = (Mat *)((ulong)stack0xfffffffffffffd30 & 0xffffffff00000000);
            mean_vals[0] = 0.0;
            mean_vals[1] = 0.0;
            norm_vals[0] = 0.003921569;
            norm_vals[1] = 0.003921569;
            norm_vals[2] = 0.003921569;
            ncnn::Mat::substract_mean_normalize(&in,mean_vals,norm_vals);
            ncnn::Net::create_extractor((Net *)&ex);
            ncnn::Extractor::input(&ex,"data",&in);
            out.cstep = 0;
            out.data = (void *)0x0;
            out.refcount._0_4_ = 0;
            out.refcount._4_4_ = 0;
            out.elemsize._0_4_ = 0;
            out.elemsize._4_4_ = 0;
            out.elempack = 0;
            out.h = 0;
            out.d = 0;
            out.c = 0;
            out.allocator = (Allocator *)0x0;
            out.dims = 0;
            out.w = 0;
            ncnn::Extractor::extract(&ex,"output",&out,0);
            if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start) {
              objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (0 < out.h) {
              lVar12 = 0;
              do {
                lVar11 = out.w * lVar12 * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize);
                local_348.height = (int)*(float *)((long)out.data + lVar11 + 4);
                local_348.width = (int)*(float *)((long)out.data + lVar11);
                local_358._0_4_ = *(float *)((long)out.data + lVar11 + 8) * (float)local_1dc;
                local_358._4_4_ = *(float *)((long)out.data + lVar11 + 0xc) * (float)local_1e0;
                uStack_350 = (Mat *)CONCAT44(*(float *)((long)out.data + lVar11 + 0x14) *
                                             (float)local_1e0 - (float)local_358._4_4_,
                                             *(float *)((long)out.data + lVar11 + 0x10) *
                                             (float)local_1dc - (float)local_358._0_4_);
                std::vector<Object,_std::allocator<Object>_>::push_back
                          (&objects,(value_type *)local_358);
                lVar12 = lVar12 + 1;
              } while (lVar12 < out.h);
            }
            local_2e4 = 0;
            piVar4 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (out.allocator == (Allocator *)0x0) {
                  if (out.data != (void *)0x0) {
                    free(out.data);
                  }
                }
                else {
                  (*(out.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            out.cstep = 0;
            out.data = (void *)0x0;
            out.refcount._0_4_ = 0;
            out.refcount._4_4_ = 0;
            out.elemsize._0_4_ = 0;
            out.elemsize._4_4_ = 0;
            out.elempack = 0;
            out.dims = 0;
            out.w = 0;
            out.h = 0;
            out.d = 0;
            out.c = 0;
            ncnn::Extractor::~Extractor(&ex);
            piVar4 = (int *)CONCAT44(in.refcount._4_4_,in.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (in.allocator == (Allocator *)0x0) {
                  if (in.data != (void *)0x0) {
                    free(in.data);
                  }
                }
                else {
                  (*(in.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            in.cstep = 0;
            in.data = (void *)0x0;
            in.refcount._0_4_ = 0;
            in.refcount._4_4_ = 0;
            in.elemsize._0_4_ = 0;
            in.elemsize._4_1_ = 0;
            in.elemsize._5_1_ = 0;
            in.elemsize._6_2_ = 0;
            in.elempack = 0;
            in.dims = 0;
            in.w = 0;
            in.h = 0;
            in.d = 0;
            in.c = 0;
            dVar2 = ncnn::get_current_time();
            fprintf(_stdout,"NCNN detection time %.02lfms\n",SUB84(dVar2 - dVar1,0));
            dVar1 = ncnn::get_current_time();
            cv::Mat::clone();
            if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start) {
              lVar12 = 0;
              uVar14 = 0;
              do {
                pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_start;
                fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                        SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                                lVar12),0),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  x + lVar12),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  y + lVar12),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  width + lVar12),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  height + lVar12),
                        (ulong)*(uint *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->label +
                                        lVar12));
                local_348.width = 0;
                local_348.height = 0;
                local_358._0_4_ = 3.7909693e-37;
                norm_vals[2] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).width + lVar12));
                norm_vals[1] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).y + lVar12));
                norm_vals[0] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).x + lVar12));
                in.data = (void *)0x406fe00000000000;
                in.refcount._0_4_ = 0;
                in.refcount._4_4_ = 0;
                in.elemsize._0_4_ = 0;
                in.elemsize._4_1_ = 0;
                in.elemsize._5_1_ = 0;
                in.elemsize._6_2_ = 0;
                in.elempack = 0;
                in._28_4_ = 0;
                uStack_350 = &out;
                cv::rectangle((string *)local_358,norm_vals,&in,1,8,0);
                sprintf((char *)&in,"%s %.1f%%",
                        SUB84((double)(*(float *)((long)&pOVar5->prob + lVar12) * 100.0),0),
                        _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                        + *(int *)(
                                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                                  + (long)*(int *)((long)&pOVar5->label + lVar12) * 4));
                baseLine = 0;
                local_358 = (undefined1  [8])&local_348;
                sVar10 = strlen((char *)&in);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_358,&in,(long)&in.data + sVar10);
                cv::getTextSize((string *)&label_size,(int)(string *)local_358,0.5,0,(int *)0x1);
                if (local_358 != (undefined1  [8])&local_348) {
                  operator_delete((void *)local_358);
                }
                iVar8 = (int)*(float *)((long)&(pOVar5->rect).x + lVar12);
                iVar13 = (int)((*(float *)((long)&(pOVar5->rect).y + lVar12) -
                               (float)label_size.height) - (float)baseLine);
                if (iVar13 < 1) {
                  iVar13 = 0;
                }
                iVar3 = out.refcount._4_4_ - label_size.width;
                if (label_size.width + iVar8 <= out.refcount._4_4_) {
                  iVar3 = iVar8;
                }
                mean_vals[0] = 3.7909693e-37;
                local_2ac = baseLine + label_size.height;
                local_2b0 = label_size.width;
                local_358 = (undefined1  [8])0x406fe00000000000;
                uStack_350 = (Mat *)0x406fe00000000000;
                local_348.width = 0;
                local_348.height = 0x406fe000;
                uStack_340 = 0;
                unique0x10001350 = &out;
                local_2b8 = iVar3;
                local_2b4 = iVar13;
                cv::rectangle(mean_vals,&local_2b8,(string *)local_358,0xffffffff,8,0);
                mean_vals[0] = 3.7909693e-37;
                local_358 = (undefined1  [8])&local_348;
                unique0x10001358 = &out;
                sVar10 = strlen((char *)&in);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_358,&in,(long)&in.data + sVar10);
                local_2bc = iVar13 + label_size.height;
                ex._vptr_Extractor = (_func_int **)0x0;
                ex.d = (ExtractorPrivate *)0x0;
                local_2c0 = iVar3;
                cv::putText(0,mean_vals,(string *)local_358,&local_2c0,0,&ex,1,8,0);
                if (local_358 != (undefined1  [8])&local_348) {
                  operator_delete((void *)local_358);
                }
                uVar14 = uVar14 + 1;
                lVar12 = lVar12 + 0x18;
              } while (uVar14 < (ulong)(((long)objects.
                                               super__Vector_base<Object,_std::allocator<Object>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)objects.
                                               super__Vector_base<Object,_std::allocator<Object>_>.
                                               _M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x5555555555555555));
            }
            in.elemsize._4_1_ = 0x65;
            in.elemsize._0_4_ = 0x67616d69;
            in.refcount._0_4_ = 5;
            in.refcount._4_4_ = 0;
            in.elemsize._5_1_ = 0;
            local_348.width = 0;
            local_348.height = 0;
            local_358._0_4_ = 0x1010000;
            uStack_350 = &out;
            in.data = &in.elemsize;
            cv::imshow((string *)&in,(_InputArray *)local_358);
            if ((size_t *)in.data != &in.elemsize) {
              operator_delete(in.data);
            }
            cv::waitKey((uint)(pcVar9 != (char *)0x0));
            cv::Mat::~Mat((Mat *)&out);
            dVar2 = ncnn::get_current_time();
            fprintf(_stdout,"NCNN OpenCV draw result time %.02lfms\n",SUB84(dVar2 - dVar1,0));
          } while (pcVar9 != (char *)0x0);
          goto LAB_0013ca12;
        }
        main_cold_1();
      }
      else {
        std::__cxx11::string::string((string *)&in,__haystack,(allocator *)&out);
        cv::VideoCapture::open((string *)&cap,(int)&in);
        if ((size_t *)in.data != &in.elemsize) {
          operator_delete(in.data);
        }
        cVar6 = cv::VideoCapture::isOpened();
        if (cVar6 == '\0') {
          pcVar9 = "Failed to open %s";
        }
        else {
          cv::VideoCapture::operator>>(&cap,&frame);
          cVar6 = cv::Mat::empty();
          if (cVar6 == '\0') goto LAB_0013c188;
          pcVar9 = "Failed to read from device %s.\n";
        }
        fprintf(_stderr,pcVar9,__haystack);
      }
    }
    else {
      fprintf(_stderr,"Failed to load model or param, error %d",(ulong)uVar7);
    }
  }
  local_2e4 = -1;
LAB_0013ca12:
  ncnn::Net::~Net(&yolov4);
  cv::VideoCapture::~VideoCapture(&cap);
  if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&frame);
  return local_2e4;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat frame;
    std::vector<Object> objects;

    cv::VideoCapture cap;

    ncnn::Net yolov4;

    const char* devicepath;

    int target_size = 0;
    int is_streaming = 0;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [v4l input device or image]\n", argv[0]);
        return -1;
    }

    devicepath = argv[1];

#ifdef NCNN_PROFILING
    double t_load_start = ncnn::get_current_time();
#endif

    int ret = init_yolov4(&yolov4, &target_size); //We load model and param first!
    if (ret != 0)
    {
        fprintf(stderr, "Failed to load model or param, error %d", ret);
        return -1;
    }

#ifdef NCNN_PROFILING
    double t_load_end = ncnn::get_current_time();
    fprintf(stdout, "NCNN Init time %.02lfms\n", t_load_end - t_load_start);
#endif

    if (strstr(devicepath, "/dev/video") == NULL)
    {
        frame = cv::imread(argv[1], 1);
        if (frame.empty())
        {
            fprintf(stderr, "Failed to read image %s.\n", argv[1]);
            return -1;
        }
    }
    else
    {
        cap.open(devicepath);

        if (!cap.isOpened())
        {
            fprintf(stderr, "Failed to open %s", devicepath);
            return -1;
        }

        cap >> frame;

        if (frame.empty())
        {
            fprintf(stderr, "Failed to read from device %s.\n", devicepath);
            return -1;
        }

        is_streaming = 1;
    }

    while (1)
    {
        if (is_streaming)
        {
#ifdef NCNN_PROFILING
            double t_capture_start = ncnn::get_current_time();
#endif

            cap >> frame;

#ifdef NCNN_PROFILING
            double t_capture_end = ncnn::get_current_time();
            fprintf(stdout, "NCNN OpenCV capture time %.02lfms\n", t_capture_end - t_capture_start);
#endif
            if (frame.empty())
            {
                fprintf(stderr, "OpenCV Failed to Capture from device %s\n", devicepath);
                return -1;
            }
        }

#ifdef NCNN_PROFILING
        double t_detect_start = ncnn::get_current_time();
#endif

        detect_yolov4(frame, objects, target_size, &yolov4); //Create an extractor and run detection

#ifdef NCNN_PROFILING
        double t_detect_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN detection time %.02lfms\n", t_detect_end - t_detect_start);
#endif

#ifdef NCNN_PROFILING
        double t_draw_start = ncnn::get_current_time();
#endif

        draw_objects(frame, objects, is_streaming); //Draw detection results on opencv image

#ifdef NCNN_PROFILING
        double t_draw_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN OpenCV draw result time %.02lfms\n", t_draw_end - t_draw_start);
#endif

        if (!is_streaming)
        {   //If it is a still image, exit!
            return 0;
        }
    }

    return 0;
}